

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O2

void Diligent::LinuxFileSystem::ClearDirectory(Char *strPath,bool Recursive)

{
  code *__func;
  allocator local_31;
  string path;
  
  std::__cxx11::string::string((string *)&path,strPath,&local_31);
  BasicFileSystem::CorrectSlashes(&path,'\0');
  __func = ClearDirectory::anon_class_1_0_00000001::__invoke;
  if (Recursive) {
    __func = ClearDirectory::anon_class_1_0_00000001::__invoke;
  }
  nftw(path._M_dataplus._M_p,__func,0x20,0xb);
  std::__cxx11::string::~string((string *)&path);
  return;
}

Assistant:

void LinuxFileSystem::ClearDirectory(const Char* strPath, bool Recursive)
{
    std::string path{strPath};
    LinuxFileSystem::CorrectSlashes(path);

    auto Callaback = Recursive ?
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            if (pFTWB->level >= 1)
                return remove(Path);
            else
                return 0;
        } :
        [](const char* Path, const struct stat* pStat, int Type, FTW* pFTWB) {
            if (pFTWB->level == 1 && !S_ISDIR(pStat->st_mode))
                return remove(Path);
            else
                return 0;
        };

    nftw(path.c_str(), Callaback, MaxOpenNTFWDescriptors, FTW_DEPTH | FTW_MOUNT | FTW_PHYS);
}